

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Sampling_Linear_Test::TestBody(Sampling_Linear_Test *this)

{
  span<const_float> f;
  bool bVar1;
  int iVar2;
  int *piVar3;
  reference pvVar4;
  Message *file;
  Message *pMVar5;
  int iVar6;
  float fVar7;
  Float FVar8;
  float fVar9;
  Float x_00;
  Float FVar10;
  Float type;
  AssertionResult gtest_ar_;
  anon_class_1_0_00000001 checkErr;
  Float x;
  Float high;
  Float low;
  Float u_2;
  Uniform1DIter __end1_2;
  Uniform1DIter __begin1_2;
  Uniform1D *__range1_2;
  RNG rng;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Float dx;
  Float dp;
  Float cp;
  Float cx;
  Float u_1;
  Uniform1DIter __end1_1;
  Uniform1DIter __begin1_1;
  Uniform1D *__range1_1;
  PiecewiseConstant1D distrib;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  anon_class_1_0_00000001 lin;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int expected;
  int i_1;
  Float t;
  Float u;
  int i;
  int nSamples;
  Float f1;
  Float f0;
  int *r;
  int (*__end1) [2];
  int (*__begin1) [2];
  int (*__range1) [5] [2];
  int ranges [5] [2];
  vector<int,_std::allocator<int>_> buckets;
  int nBuckets;
  Float in_stack_fffffffffffffb68;
  Float in_stack_fffffffffffffb6c;
  PiecewiseConstant1D *in_stack_fffffffffffffb70;
  PiecewiseConstant1D *in_stack_fffffffffffffb78;
  Allocator in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb90;
  Type in_stack_fffffffffffffb9c;
  AssertHelper *in_stack_fffffffffffffba0;
  int *in_stack_fffffffffffffba8;
  Float *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  PiecewiseConstant1D *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbe4;
  AssertionResult *in_stack_fffffffffffffbe8;
  AssertHelper *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  function<float_(float)> *in_stack_fffffffffffffc00;
  Allocator in_stack_fffffffffffffc08;
  Message *in_stack_fffffffffffffc20;
  Message *in_stack_fffffffffffffc28;
  Message *in_stack_fffffffffffffc30;
  Message *in_stack_fffffffffffffc38;
  string local_340 [44];
  Float local_314;
  AssertionResult local_308;
  Float local_2f0;
  float local_2ec;
  float local_2e8;
  Float local_2e4;
  IndexingIterator<pbrt::detail::Uniform1DIter> local_2c8 [3];
  undefined1 local_2b0 [24];
  undefined1 *local_298;
  RNG local_290 [2];
  undefined8 local_270;
  float local_264;
  AssertionResult local_260 [2];
  undefined8 local_240;
  float local_234;
  AssertionResult local_230;
  Float local_21c;
  float local_218;
  Float local_214;
  Float local_210;
  Float local_20c;
  IndexingIterator<pbrt::detail::Uniform1DIter> local_1f0 [3];
  undefined1 local_1d8 [24];
  undefined1 *local_1c0;
  undefined1 local_1a0 [176];
  double local_f0;
  AssertionResult local_e8 [2];
  double local_c8;
  AssertionResult local_c0;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  Float local_a0;
  float local_9c;
  int local_98;
  int local_94;
  float local_90;
  float local_8c;
  int *local_88;
  int *local_80;
  int *local_78;
  int *local_70;
  int local_68 [10];
  int aiStack_40 [5];
  undefined4 local_2c;
  vector<int,_std::allocator<int>_> local_28;
  int local_c;
  
  local_c = 0x20;
  local_2c = 0;
  std::allocator<int>::allocator((allocator<int> *)0x63d7fa);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffb90,CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
             ,(value_type_conflict3 *)in_stack_fffffffffffffb80.memoryResource,
             (allocator_type *)in_stack_fffffffffffffb78);
  std::allocator<int>::~allocator((allocator<int> *)0x63d82e);
  memcpy(local_68,&DAT_00b38810,0x28);
  local_80 = aiStack_40;
  local_78 = local_68;
  local_70 = local_78;
  for (; local_78 != local_80; local_78 = local_78 + 2) {
    local_88 = local_78;
    local_8c = (float)*local_78;
    local_90 = (float)local_78[1];
    local_94 = 1000000;
    for (local_98 = 0; local_98 < local_94; local_98 = local_98 + 1) {
      local_9c = ((float)local_98 + 0.5) / (float)local_94;
      local_a0 = pbrt::SampleLinear((Float)((ulong)in_stack_fffffffffffffb80.memoryResource >> 0x20)
                                    ,SUB84(in_stack_fffffffffffffb80.memoryResource,0),
                                    (Float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
      local_a4 = (int)(local_a0 * (float)local_c);
      local_a8 = local_c + -1;
      piVar3 = std::min<int>(&local_a4,&local_a8);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)*piVar3);
      *pvVar4 = *pvVar4 + 1;
    }
    for (local_ac = 0; local_ac < local_c; local_ac = local_ac + 1) {
      fVar7 = (float)local_ac;
      iVar2 = local_c + -1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,0);
      iVar6 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)(local_c + -1));
      FVar8 = pbrt::Lerp(fVar7 / (float)iVar2,(float)iVar6,(float)*pvVar4);
      local_b0 = (int)FVar8;
      std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_ac);
      local_c8 = (double)local_b0 * 0.99;
      testing::internal::CmpHelperGE<int,double>
                ((char *)in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
                 (int *)in_stack_fffffffffffffc28,(double *)in_stack_fffffffffffffc20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffba0);
        testing::AssertionResult::failure_message((AssertionResult *)0x63db99);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                   (char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                   (char *)in_stack_fffffffffffffb80.memoryResource);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
        testing::Message::~Message((Message *)0x63dbfc);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x63dc54);
      std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_ac);
      local_f0 = (double)local_b0 * 1.01;
      testing::internal::CmpHelperLE<int,double>
                ((char *)in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
                 (int *)in_stack_fffffffffffffc28,(double *)in_stack_fffffffffffffc20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffba0);
        testing::AssertionResult::failure_message((AssertionResult *)0x63dd1e);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                   (char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                   (char *)in_stack_fffffffffffffb80.memoryResource);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
        testing::Message::~Message((Message *)0x63dd81);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x63ddd6);
    }
  }
  std::function<float(float)>::function<Sampling_Linear_Test::TestBody()::__0&,void>
            ((function<float_(float)> *)in_stack_fffffffffffffb80.memoryResource,
             (anon_class_1_0_00000001 *)in_stack_fffffffffffffb78);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffb70);
  pbrt::Sample1DFunction
            (in_stack_fffffffffffffc00,(int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
             (int)in_stack_fffffffffffffbf8,(Float)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
             SUB84(in_stack_fffffffffffffbf0,0),in_stack_fffffffffffffc08);
  std::function<float_(float)>::~function((function<float_(float)> *)0x63de85);
  pstd::span<float_const>::
  span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
            ((span<const_float> *)in_stack_fffffffffffffb80.memoryResource,
             &in_stack_fffffffffffffb78->func);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffb70);
  f.ptr._4_4_ = in_stack_fffffffffffffb8c;
  f.ptr._0_4_ = in_stack_fffffffffffffb88;
  f.n = (size_t)in_stack_fffffffffffffb90;
  pbrt::PiecewiseConstant1D::PiecewiseConstant1D
            (in_stack_fffffffffffffb78,f,in_stack_fffffffffffffb80);
  pbrt::Uniform1D::RNGGenerator
            ((Uniform1D *)in_stack_fffffffffffffb80.memoryResource,
             (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),(uint64_t)in_stack_fffffffffffffb70,
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  local_1c0 = local_1d8;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
             in_stack_fffffffffffffb70);
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
             in_stack_fffffffffffffb70);
  while (bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator!=
                           ((IndexingIterator<pbrt::detail::Uniform1DIter> *)
                            in_stack_fffffffffffffb70,
                            (Uniform1DIter *)
                            CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)), bVar1) {
    local_20c = pbrt::detail::Uniform1DIter::operator*((Uniform1DIter *)0x63df6b);
    local_210 = pbrt::SampleLinear((Float)((ulong)in_stack_fffffffffffffb80.memoryResource >> 0x20),
                                   SUB84(in_stack_fffffffffffffb80.memoryResource,0),
                                   (Float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    local_214 = pbrt::LinearPDF(SUB84(in_stack_fffffffffffffb70,0),in_stack_fffffffffffffb6c,
                                in_stack_fffffffffffffb68);
    iVar6 = (int)local_1a0;
    local_21c = pbrt::PiecewiseConstant1D::Sample
                          (in_stack_fffffffffffffbc0,
                           (Float)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                           in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    fVar7 = local_210 - local_21c;
    std::abs(iVar6);
    local_240 = 0x3f689374bc6a7efa;
    local_234 = fVar7;
    testing::internal::CmpHelperLT<float,double>
              ((char *)in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
               (float *)in_stack_fffffffffffffc28,(double *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_230);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffba0);
      in_stack_fffffffffffffc38 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffb70,
                      (char (*) [15])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      in_stack_fffffffffffffc30 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffb70,
                      (float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      in_stack_fffffffffffffc28 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffb70,
                      (char (*) [13])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      in_stack_fffffffffffffc20 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffb70,
                      (float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      testing::AssertionResult::failure_message((AssertionResult *)0x63e1e3);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                 (char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                 (char *)in_stack_fffffffffffffb80.memoryResource);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
      testing::Message::~Message((Message *)0x63e246);
    }
    iVar6 = (int)&local_230;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x63e29e);
    fVar7 = local_214 - local_218;
    std::abs(iVar6);
    local_270 = 0x3f689374bc6a7efa;
    local_264 = fVar7;
    testing::internal::CmpHelperLT<float,double>
              ((char *)in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
               (float *)in_stack_fffffffffffffc28,(double *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_260);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffba0);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffb70,
                 (char (*) [19])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffb70,
                 (float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffb70,
                 (char (*) [17])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      in_stack_fffffffffffffbf0 =
           (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffb70,
                      (float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      in_stack_fffffffffffffbe8 =
           (AssertionResult *)testing::AssertionResult::failure_message((AssertionResult *)0x63e3fe)
      ;
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                 (char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                 (char *)in_stack_fffffffffffffb80.memoryResource);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
      testing::Message::~Message((Message *)0x63e461);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x63e4b6);
    pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator++(local_1f0);
  }
  pbrt::RNG::RNG(local_290);
  pbrt::Uniform1D::RNGGenerator
            ((Uniform1D *)in_stack_fffffffffffffb80.memoryResource,
             (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),(uint64_t)in_stack_fffffffffffffb70,
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  local_298 = local_2b0;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
             in_stack_fffffffffffffb70);
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
             in_stack_fffffffffffffb70);
  while( true ) {
    bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator!=
                      ((IndexingIterator<pbrt::detail::Uniform1DIter> *)in_stack_fffffffffffffb70,
                       (Uniform1DIter *)
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    in_stack_fffffffffffffbe4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbe4);
    if (!bVar1) break;
    FVar8 = pbrt::detail::Uniform1DIter::operator*((Uniform1DIter *)0x63e582);
    local_2e4 = FVar8;
    fVar7 = pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffb70);
    local_2e8 = fVar7 * 10.0;
    fVar9 = pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffb70);
    local_2ec = fVar9 * 10.0;
    if (local_2e8 < local_2ec) {
      pstd::swap<float>(&local_2e8,&local_2ec);
    }
    x_00 = pbrt::SampleLinear((Float)((ulong)in_stack_fffffffffffffb80.memoryResource >> 0x20),
                              SUB84(in_stack_fffffffffffffb80.memoryResource,0),
                              (Float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    local_2f0 = x_00;
    FVar10 = pbrt::InvertLinearSample(x_00,local_2e8,local_2ec);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_fffffffffffffb80.memoryResource,
               (Float)((ulong)in_stack_fffffffffffffb78 >> 0x20),SUB84(in_stack_fffffffffffffb78,0))
    ;
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffb70,
               SUB41((uint)in_stack_fffffffffffffb6c >> 0x18,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffba0);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffb70,
                 (char (*) [6])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffb70,
                 (float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffb70,
                 (char (*) [7])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffb70,
                 (float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      in_stack_fffffffffffffba0 =
           (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffb70,
                      (char (*) [5])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      type = pbrt::InvertLinearSample(local_2f0,local_2e8,local_2ec);
      local_314 = type;
      file = testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffb70,
                        (float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      pMVar5 = testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffb70,
                          (char (*) [8])
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      iVar6 = (int)((ulong)pMVar5 >> 0x20);
      in_stack_fffffffffffffb80.memoryResource =
           (memory_resource *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffb70,
                      (float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      in_stack_fffffffffffffb78 =
           (PiecewiseConstant1D *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffb70,
                      (char (*) [4])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      in_stack_fffffffffffffb70 =
           (PiecewiseConstant1D *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffb70,
                      (float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffbe8,(char *)CONCAT44(in_stack_fffffffffffffbe4,FVar8),
                 (char *)CONCAT44(fVar7,fVar9),(char *)CONCAT44(x_00,FVar10));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffba0,(Type)type,(char *)file,iVar6,
                 (char *)in_stack_fffffffffffffb80.memoryResource);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
      std::__cxx11::string::~string(local_340);
      testing::Message::~Message((Message *)0x63e8e2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x63e95a);
    pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator++(local_2c8);
  }
  pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(in_stack_fffffffffffffb70);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            (&in_stack_fffffffffffffb70->func);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb80.memoryResource);
  return;
}

Assistant:

TEST(Sampling, Linear) {
    int nBuckets = 32;
    std::vector<int> buckets(nBuckets, 0);

    int ranges[][2] = {{0, 1}, {1, 2}, {5, 50}, {100, 0}, {75, 50}};
    for (const auto r : ranges) {
        Float f0 = r[0], f1 = r[1];
        int nSamples = 1000000;
        for (int i = 0; i < nSamples; ++i) {
            Float u = (i + .5) / nSamples;
            Float t = SampleLinear(u, f0, f1);
            ++buckets[std::min<int>(t * nBuckets, nBuckets - 1)];
        }

        for (int i = 0; i < nBuckets; ++i) {
            int expected =
                Lerp(Float(i) / (nBuckets - 1), buckets[0], buckets[nBuckets - 1]);
            EXPECT_GE(buckets[i], .99 * expected);
            EXPECT_LE(buckets[i], 1.01 * expected);
        }
    }

    auto lin = [](Float v) { return 1 + 3 * v; };
    auto values = Sample1DFunction(lin, 1024, 64 * 1024, 0.f, 1.f);
    PiecewiseConstant1D distrib(values);
    for (Float u : Uniform1D(100)) {
        Float cx = SampleLinear(u, 1, 4);
        Float cp = LinearPDF(cx, 1, 4);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }

    RNG rng;
    for (Float u : Uniform1D(100)) {
        Float low = rng.Uniform<Float>() * 10;
        Float high = rng.Uniform<Float>() * 10;
        if (low < high)
            pstd::swap(low, high);
        Float x = SampleLinear(u, low, high);

        auto checkErr = [](Float a, Float b) {
            Float err;
            if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                err = std::abs(a - b);
            else
                err = std::abs(2 * (a - b) / (a + b));
            return err > 1e-2;
        };

        EXPECT_FALSE(checkErr(u, InvertLinearSample(x, low, high)))
            << " u = " << u << " -> x " << x << " -> " << InvertLinearSample(x, low, high)
            << " (over " << low << " - " << high;
    }
}